

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O2

int oonf_packet_add(oonf_packet_socket *pktsocket,netaddr_socket *local,os_interface *os_if)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = os_fd_generic_getsocket
                    (&(pktsocket->scheduler_entry).fd,local,false,0,os_if,
                     _oonf_packet_socket_subsystem.logging);
  if (iVar1 == 0) {
    _packet_add(pktsocket,local,os_if);
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
oonf_packet_add(struct oonf_packet_socket *pktsocket, union netaddr_socket *local, struct os_interface *os_if) {
  /* Init socket */
  if (os_fd_getsocket(&pktsocket->scheduler_entry.fd, local, false, 0, os_if, LOG_PACKET)) {
    return -1;
  }

  _packet_add(pktsocket, local, os_if);
  return 0;
}